

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

Pair * __thiscall TagVecOfTags::pair(TagVecOfTags *this)

{
  QString *pQVar1;
  int *piVar2;
  long in_RSI;
  Pair *in_RDI;
  Pair *pair;
  Pair *in_stack_ffffffffffffffb0;
  
  Configuration::Pair::Pair(in_stack_ffffffffffffffb0);
  pQVar1 = cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::value
                     ((tag_scalar_t<QString,_cfgfile::qstring_trait_t> *)(in_RSI + 0x58));
  QString::operator=(&in_RDI->m_stringValue,pQVar1);
  piVar2 = cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::value
                     ((tag_scalar_t<int,_cfgfile::qstring_trait_t> *)(in_RSI + 0xd0));
  in_RDI->m_intValue = *piVar2;
  return in_RDI;
}

Assistant:

Configuration::Pair
TagVecOfTags::pair() const
{
	Configuration::Pair pair;

	pair.m_stringValue = m_stringValue.value();
	pair.m_intValue = m_intValue.value();

	return pair;
}